

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::ArrayColumnData::Checkpoint
          (ArrayColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  PartialBlockManager *partial_block_manager;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var2;
  unique_ptr<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>_>
  this_00;
  pointer pAVar3;
  pointer pCVar4;
  undefined8 *in_RCX;
  templated_unique_single_t checkpoint_state;
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> local_40;
  _Head_base<0UL,_duckdb::ArrayColumnCheckpointState_*,_false> local_38;
  
  partial_block_manager = *(PartialBlockManager **)*in_RCX;
  this_00._M_t.
  super___uniq_ptr_impl<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ArrayColumnCheckpointState_*,_std::default_delete<duckdb::ArrayColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ArrayColumnCheckpointState_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>,_true,_true>
        )operator_new(0xa0);
  ArrayColumnCheckpointState::ArrayColumnCheckpointState
            ((ArrayColumnCheckpointState *)
             this_00._M_t.
             super___uniq_ptr_impl<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ArrayColumnCheckpointState_*,_std::default_delete<duckdb::ArrayColumnCheckpointState>_>
             .super__Head_base<0UL,_duckdb::ArrayColumnCheckpointState_*,_false>._M_head_impl,
             (RowGroup *)checkpoint_info,(ColumnData *)row_group,partial_block_manager);
  local_38._M_head_impl =
       (ArrayColumnCheckpointState *)
       this_00._M_t.
       super___uniq_ptr_impl<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrayColumnCheckpointState_*,_std::default_delete<duckdb::ArrayColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ArrayColumnCheckpointState_*,_false>._M_head_impl;
  ColumnData::Checkpoint
            ((ColumnData *)&stack0xffffffffffffffc0,
             (RowGroup *)
             &row_group[1].columns.
              super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,checkpoint_info);
  pAVar3 = unique_ptr<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>,_true>
                         *)&stack0xffffffffffffffc8);
  _Var2._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ColumnCheckpointState *)0x0;
  _Var1._M_head_impl =
       (pAVar3->validity_state).
       super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  (pAVar3->validity_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ColumnCheckpointState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnCheckpointState + 8))();
  }
  if (local_40._M_head_impl != (ColumnCheckpointState *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ColumnCheckpointState[1])();
  }
  pCVar4 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     ((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                       *)&row_group[1].columns.
                          super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                          .
                          super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  (*pCVar4->_vptr_ColumnData[0x1c])(&stack0xffffffffffffffc0,pCVar4,checkpoint_info);
  pAVar3 = unique_ptr<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ArrayColumnCheckpointState,_std::default_delete<duckdb::ArrayColumnCheckpointState>,_true>
                         *)&stack0xffffffffffffffc8);
  _Var2._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ColumnCheckpointState *)0x0;
  _Var1._M_head_impl =
       (pAVar3->child_state).
       super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  (pAVar3->child_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ColumnCheckpointState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnCheckpointState + 8))();
  }
  if (local_40._M_head_impl != (ColumnCheckpointState *)0x0) {
    (**(code **)(*(_func_int **)local_40._M_head_impl + 8))();
  }
  (this->super_ColumnData)._vptr_ColumnData = (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )this;
}

Assistant:

unique_ptr<ColumnCheckpointState> ArrayColumnData::Checkpoint(RowGroup &row_group,
                                                              ColumnCheckpointInfo &checkpoint_info) {

	auto checkpoint_state = make_uniq<ArrayColumnCheckpointState>(row_group, *this, checkpoint_info.info.manager);
	checkpoint_state->validity_state = validity.Checkpoint(row_group, checkpoint_info);
	checkpoint_state->child_state = child_column->Checkpoint(row_group, checkpoint_info);
	return std::move(checkpoint_state);
}